

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_read.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  uint8_t *puVar3;
  int32_t *piVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  string_ref sVar6;
  chars local_2c1;
  string_ref local_2c0;
  undefined1 local_2b0 [8];
  excerpt_tailer tailer;
  vanilla_chronicle chronicle;
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  vanilla_chronicle_settings settings;
  int val;
  
  settings.m_data_cache_size._0_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"/tmp/example",&local_b9);
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings
            ((vanilla_chronicle_settings *)local_98,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  cornelich::vanilla_chronicle::vanilla_chronicle
            ((vanilla_chronicle *)&tailer.m_buffer.m_data,(vanilla_chronicle_settings *)local_98);
  cornelich::vanilla_chronicle::create_tailer
            ((excerpt_tailer *)local_2b0,(vanilla_chronicle *)&tailer.m_buffer.m_data);
  do {
    do {
      bVar1 = cornelich::excerpt_tailer::next_index((excerpt_tailer *)local_2b0);
    } while (!bVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"int:  ");
    puVar3 = cornelich::util::buffer_view::data((buffer_view *)&tailer.m_last_thread_id);
    piVar4 = cornelich::util::buffer_view::position((buffer_view *)&tailer.m_last_thread_id);
    settings.m_data_cache_size._4_4_ = *(int *)(puVar3 + *piVar4);
    piVar4 = cornelich::util::buffer_view::position((buffer_view *)&tailer.m_last_thread_id);
    *piVar4 = *piVar4 + 4;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,settings.m_data_cache_size._4_4_);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"text: ");
    puVar3 = cornelich::util::buffer_view::data((buffer_view *)&tailer.m_last_thread_id);
    piVar4 = cornelich::util::buffer_view::position((buffer_view *)&tailer.m_last_thread_id);
    sVar6 = cornelich::readers::chars::operator()(&local_2c1,puVar3,piVar4);
    local_2c0 = sVar6;
    pbVar5 = boost::operator<<(poVar2,&local_2c0);
    std::operator<<(pbVar5,'\n');
  } while( true );
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto tailer = chronicle.create_tailer();
    while(true)
    {
        if(!tailer.next_index())
            continue;
        std::cout << "int:  " << tailer.read<int>() << '\n';
        std::cout << "text: " << tailer.read(chr::readers::chars()) << '\n';
    }

}